

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall
lattice::graph::graph(graph *this,basis *bs,unitcell *cell,span_t *span,boundary_t boundary)

{
  unitcell *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  graph *in_RDI;
  supercell *this_00;
  allocator_type *__a;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_01;
  vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *this_02;
  span_t *in_stack_ffffffffffffff18;
  supercell *in_stack_ffffffffffffff20;
  
  __a = (allocator_type *)&in_RDI->sites_;
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::vector
            ((vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_> *)0x102e2a);
  this_01 = &in_RDI->coordinates_;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)0x102e3d);
  this_02 = &in_RDI->bonds_;
  std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::vector
            ((vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_> *)0x102e50);
  supercell::supercell(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  unitcell::dimension(in_RDX);
  this_00 = (supercell *)&stack0xffffffffffffff1f;
  std::allocator<lattice::boundary_t>::allocator((allocator<lattice::boundary_t> *)0x102e9e);
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::vector
            ((vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *)this_02,
             (size_type)in_RDI,(value_type *)this_01,__a);
  init(in_RDI,in_RSI);
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::~vector
            ((vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> *)this_01);
  std::allocator<lattice::boundary_t>::~allocator((allocator<lattice::boundary_t> *)0x102eef);
  supercell::~supercell(this_00);
  return;
}

Assistant:

graph(const basis& bs, const unitcell& cell, const span_t& span,
        boundary_t boundary = boundary_t::periodic) {
    init(bs, cell, supercell(span), std::vector<boundary_t>(cell.dimension(), boundary));
  }